

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::RemoveLast(Reflection *this,Message *message,FieldDescriptor *field)

{
  byte bVar1;
  Descriptor *expected;
  bool bVar2;
  uint32_t uVar3;
  CppStringType CVar4;
  RepeatedField<int> *this_00;
  RepeatedField<unsigned_long> *this_01;
  MapFieldBase *this_02;
  RepeatedPtrFieldBase *pRVar5;
  RepeatedField<long> *this_03;
  RepeatedField<unsigned_int> *this_04;
  RepeatedField<bool> *this_05;
  RepeatedField<double> *this_06;
  RepeatedField<float> *this_07;
  RepeatedField<absl::lts_20250127::Cord> *this_08;
  char *description;
  Metadata MVar6;
  
  MVar6 = Message::GetMetadata(message);
  if (MVar6.reflection != this) {
LAB_0025454c:
    expected = this->descriptor_;
    MVar6 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(expected,MVar6.descriptor,field,"RemoveLast");
  }
  if (field->containing_type_ == this->descriptor_) {
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
      RemoveLast();
      goto LAB_0025454c;
    }
    if ((bVar1 & 0x20) != 0) {
      if ((bVar1 & 8) != 0) {
        uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        internal::ExtensionSet::RemoveLast
                  ((ExtensionSet *)
                   ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                   field->number_);
        return;
      }
      switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
      case 1:
      case 8:
        VerifyFieldType<google::protobuf::RepeatedField<int>>(this,field);
        this_00 = (RepeatedField<int> *)MutableRawImpl(this,message,field);
        RepeatedField<int>::RemoveLast(this_00);
        return;
      case 2:
        VerifyFieldType<google::protobuf::RepeatedField<long>>(this,field);
        this_03 = (RepeatedField<long> *)MutableRawImpl(this,message,field);
        RepeatedField<long>::RemoveLast(this_03);
        return;
      case 3:
        VerifyFieldType<google::protobuf::RepeatedField<unsigned_int>>(this,field);
        this_04 = (RepeatedField<unsigned_int> *)MutableRawImpl(this,message,field);
        RepeatedField<unsigned_int>::RemoveLast(this_04);
        return;
      case 4:
        VerifyFieldType<google::protobuf::RepeatedField<unsigned_long>>(this,field);
        this_01 = (RepeatedField<unsigned_long> *)MutableRawImpl(this,message,field);
        RepeatedField<unsigned_long>::RemoveLast(this_01);
        return;
      case 5:
        VerifyFieldType<google::protobuf::RepeatedField<double>>(this,field);
        this_06 = (RepeatedField<double> *)MutableRawImpl(this,message,field);
        RepeatedField<double>::RemoveLast(this_06);
        return;
      case 6:
        VerifyFieldType<google::protobuf::RepeatedField<float>>(this,field);
        this_07 = (RepeatedField<float> *)MutableRawImpl(this,message,field);
        RepeatedField<float>::RemoveLast(this_07);
        return;
      case 7:
        VerifyFieldType<google::protobuf::RepeatedField<bool>>(this,field);
        this_05 = (RepeatedField<bool> *)MutableRawImpl(this,message,field);
        RepeatedField<bool>::RemoveLast(this_05);
        return;
      case 9:
        CVar4 = FieldDescriptor::cpp_string_type(field);
        if ((CVar4 == kView) || (CVar4 == kString)) {
          VerifyFieldType<google::protobuf::RepeatedPtrField<std::__cxx11::string>>(this,field);
          pRVar5 = (RepeatedPtrFieldBase *)MutableRawImpl(this,message,field);
          internal::RepeatedPtrFieldBase::
          RemoveLast<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>(pRVar5);
          return;
        }
        if (CVar4 == kCord) {
          VerifyFieldType<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>(this,field);
          this_08 = (RepeatedField<absl::lts_20250127::Cord> *)MutableRawImpl(this,message,field);
          RepeatedField<absl::lts_20250127::Cord>::RemoveLast(this_08);
          return;
        }
        break;
      case 10:
        if ((field->type_ == 0xb) && (bVar2 = FieldDescriptor::is_map_message_type(field), bVar2)) {
          VerifyFieldType<google::protobuf::internal::MapFieldBase>(this,field);
          this_02 = (MapFieldBase *)MutableRawImpl(this,message,field);
          pRVar5 = internal::MapFieldBase::MutableRepeatedField(this_02);
        }
        else {
          VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(this,field);
          pRVar5 = (RepeatedPtrFieldBase *)MutableRawImpl(this,message,field);
        }
        internal::RepeatedPtrFieldBase::
        RemoveLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                  (pRVar5);
        return;
      }
      return;
    }
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(this->descriptor_,field,"RemoveLast",description);
}

Assistant:

void Reflection::RemoveLast(Message* message,
                            const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE(RemoveLast, message);
  USAGE_CHECK_MESSAGE_TYPE(RemoveLast);
  USAGE_CHECK_REPEATED(RemoveLast);

  if (field->is_extension()) {
    MutableExtensionSet(message)->RemoveLast(field->number());
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                             \
    MutableRaw<RepeatedField<LOWERCASE> >(message, field)->RemoveLast(); \
    break

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->cpp_string_type()) {
          case FieldDescriptor::CppStringType::kCord:
            MutableRaw<RepeatedField<absl::Cord>>(message, field)->RemoveLast();
            break;
          case FieldDescriptor::CppStringType::kView:
          case FieldDescriptor::CppStringType::kString:
            MutableRaw<RepeatedPtrField<std::string> >(message, field)
                ->RemoveLast();
            break;
        }
        break;

      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)
              ->MutableRepeatedField()
              ->RemoveLast<GenericTypeHandler<Message> >();
        } else {
          MutableRaw<RepeatedPtrFieldBase>(message, field)
              ->RemoveLast<GenericTypeHandler<Message> >();
        }
        break;
    }
  }
}